

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<wchar_t,_fmt::v6::basic_format_specs<wchar_t>_>::on_hex
          (int_writer<wchar_t,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  format_specs *pfVar2;
  bool bVar3;
  uint uVar4;
  int num_digits;
  string_view prefix;
  hex_writer f;
  
  pfVar2 = this->specs;
  if ((char)pfVar2->field_0x9 < '\0') {
    uVar4 = this->prefix_size;
    this->prefix_size = uVar4 + 1;
    this->prefix[uVar4] = '0';
    cVar1 = pfVar2->type;
    uVar4 = this->prefix_size;
    this->prefix_size = uVar4 + 1;
    this->prefix[uVar4] = cVar1;
  }
  num_digits = 0;
  uVar4 = this->abs_value;
  do {
    num_digits = num_digits + 1;
    bVar3 = 0xf < uVar4;
    uVar4 = uVar4 >> 4;
  } while (bVar3);
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  f.num_digits = num_digits;
  f.self = this;
  f._12_4_ = 0;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<wchar_t,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,num_digits,prefix,*pfVar2,
             f);
  return;
}

Assistant:

void on_hex() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = specs.type;
      }
      int num_digits = count_digits<4>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       hex_writer{*this, num_digits});
    }